

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void kname(Proto *p,int pc,int c,char **name)

{
  TValue *pTVar1;
  char *pcVar2;
  char *what;
  TValue *kvalue;
  char **name_local;
  int c_local;
  int pc_local;
  Proto *p_local;
  
  if ((c & 0x80U) == 0) {
    pcVar2 = getobjname(p,pc,c,name);
    if ((pcVar2 != (char *)0x0) && (*pcVar2 == 'c')) {
      return;
    }
  }
  else {
    pTVar1 = p->k + (int)(c & 0xffffff7f);
    if ((pTVar1->tt_ & 0xf) == 4) {
      if ((pTVar1->tt_ & 0xf) != 4) {
        __assert_fail("(((((((kvalue))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0x17f,"void kname(Proto *, int, int, const char **)");
      }
      if ((((pTVar1->value_).gc)->tt & 0xf) == 4) {
        *name = (char *)((pTVar1->value_).f + 0x18);
        return;
      }
      __assert_fail("(((((kvalue)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x17f,"void kname(Proto *, int, int, const char **)");
    }
  }
  *name = "?";
  return;
}

Assistant:

static void kname (Proto *p, int pc, int c, const char **name) {
  if (ISK(c)) {  /* is 'c' a constant? */
    TValue *kvalue = &p->k[INDEXK(c)];
    if (ttisstring(kvalue)) {  /* literal constant? */
      *name = svalue(kvalue);  /* it is its own name */
      return;
    }
    /* else no reasonable name found */
  }
  else {  /* 'c' is a register */
    const char *what = getobjname(p, pc, c, name); /* search for 'c' */
    if (what && *what == 'c') {  /* found a constant name? */
      return;  /* 'name' already filled */
    }
    /* else no reasonable name found */
  }
  *name = "?";  /* no reasonable name found */
}